

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

Reference<std::allocator<absl::LogSink_*>_> __thiscall
absl::inlined_vector_internal::Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>>::
EmplaceBack<absl::LogSink*const&>
          (Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *this,LogSink **args)

{
  LogSink **ppLVar1;
  ulong uVar2;
  Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *pSVar3;
  ulong uVar4;
  size_type __n;
  LogSink **ppLStack_48;
  size_type sStack_40;
  LogSink **ppLStack_38;
  
  uVar4 = *(ulong *)this;
  uVar2 = 0x10;
  if ((uVar4 & 1) != 0) {
    uVar2 = *(ulong *)(this + 0x10);
  }
  if (uVar4 >> 1 != uVar2) {
    if ((uVar4 & 1) == 0) {
      pSVar3 = this + 8;
    }
    else {
      pSVar3 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
    }
    *(ValueType<std::allocator<absl::LogSink_*>_> *)(pSVar3 + (uVar4 >> 1) * 8) = *args;
    *(ulong *)this = uVar4 + 2;
    return (Reference<std::allocator<absl::LogSink_*>_>)(pSVar3 + (uVar4 >> 1) * 8);
  }
  uVar4 = *(ulong *)this;
  pSVar3 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
  uVar2 = uVar4 >> 1;
  ppLStack_48 = (LogSink **)0x0;
  sStack_40 = 0;
  __n = 0x20;
  if ((uVar4 & 1) != 0) {
    __n = *(long *)(this + 0x10) * 2;
  }
  ppLStack_38 = args;
  ppLStack_48 = __gnu_cxx::new_allocator<absl::LogSink_*>::allocate
                          ((new_allocator<absl::LogSink_*> *)&ppLStack_48,__n,(void *)0x0);
  ppLStack_48[uVar2] = *ppLStack_38;
  if (1 < uVar4) {
    if ((uVar4 & 1) == 0) {
      pSVar3 = this + 8;
    }
    uVar4 = 0;
    do {
      ppLStack_48[uVar4] = *(LogSink **)(pSVar3 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  ppLVar1 = ppLStack_48 + uVar2;
  uVar4 = *(ulong *)this;
  sStack_40 = __n;
  if ((uVar4 & 1) != 0) {
    operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    uVar4 = *(ulong *)this;
  }
  *(LogSink ***)(this + 8) = ppLStack_48;
  *(size_type *)(this + 0x10) = sStack_40;
  *(ulong *)this = (uVar4 | 1) + 2;
  return ppLVar1;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }